

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O2

string * __thiscall flow::Value::to_string_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  LiteralType *in_R9;
  string_view format_str;
  
  format_str.size_ = (size_t)&this->name_;
  format_str.data_ = (char *)0x13;
  fmt::v5::format<std::__cxx11::string,flow::LiteralType>
            (__return_storage_ptr__,(v5 *)"Value {} of type {}",format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->type_,in_R9
            );
  return __return_storage_ptr__;
}

Assistant:

std::string Value::to_string() const {
  return fmt::format("Value {} of type {}", name_, type_);
}